

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcVector.h
# Opt level: O3

void __thiscall o3dgc::Vector<char>::Allocate(Vector<char> *this,unsigned_long size)

{
  char *__src;
  char *__dest;
  
  if (this->m_allocated < size) {
    this->m_allocated = size;
    __dest = (char *)operator_new__(size);
    if (this->m_size != 0) {
      __src = this->m_buffer;
      memcpy(__dest,__src,this->m_size);
      if (__src != (char *)0x0) {
        operator_delete__(__src);
      }
    }
    this->m_buffer = __dest;
  }
  return;
}

Assistant:

void                    Allocate(unsigned long size)
                                {
                                    if (size > m_allocated)
                                    {
                                        m_allocated = size;
                                        T * tmp     = new T [m_allocated];
                                        if (m_size > 0)
                                        {
                                            memcpy(tmp, m_buffer, m_size * sizeof(T) );
                                            delete [] m_buffer;
                                        }
                                        m_buffer = tmp;
                                    }
                                }